

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

int container_rank(container_t *c,uint8_t type,uint16_t x)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  uVar3 = (uint)CONCAT71(in_register_00000031,type);
  if (uVar3 == 4) {
    uVar3 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar3 != '\x03') {
    if ((uVar3 & 0xff) == 2) {
      iVar1 = array_container_rank((array_container_t *)c,x);
      return iVar1;
    }
    iVar1 = 0;
    for (uVar4 = 0; x >> 6 != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = *(ulong *)(((array_container_t *)c)->array + uVar4 * 4);
      uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
      uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
      iVar1 = iVar1 + (uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38);
    }
    uVar4 = (2L << ((byte)x & 0x3f)) - 1U &
            *(ulong *)(((array_container_t *)c)->array + (ulong)(x >> 6) * 4);
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    return iVar1 + (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38);
  }
  iVar1 = run_container_rank((run_container_t *)c,x);
  return iVar1;
}

Assistant:

static inline int container_rank(const container_t *c, uint8_t type,
                                 uint16_t x) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_rank(const_CAST_bitset(c), x);
        case ARRAY_CONTAINER_TYPE:
            return array_container_rank(const_CAST_array(c), x);
        case RUN_CONTAINER_TYPE:
            return run_container_rank(const_CAST_run(c), x);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}